

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O1

bool __thiscall BamTools::SplitTool::SplitToolPrivate::SplitTag(SplitToolPrivate *this)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  byte unaff_BPL;
  char arrayTagType;
  char tagType;
  BamAlignment al;
  byte local_18b;
  byte local_18a;
  byte local_189;
  BamAlignment local_188;
  
  BamAlignment::BamAlignment(&local_188);
  do {
    bVar1 = BamReader::GetNextAlignment(&this->m_reader,&local_188);
    if (!bVar1) {
      unaff_BPL = 1;
      break;
    }
    local_18a = 0;
    bVar2 = BamAlignment::GetTagType(&local_188,&this->m_settings->TagToSplit,(char *)&local_18a);
    bVar1 = true;
    if (bVar2) {
      if (local_18a < 0x53) {
        switch(local_18a) {
        case 0x41:
        case 0x48:
switchD_00136c21_caseD_41:
          unaff_BPL = SplitTagImpl<std::__cxx11::string>(this,&local_188);
          break;
        case 0x42:
          local_18b = 0;
          bVar1 = BamAlignment::GetArrayTagType
                            (&local_188,&this->m_settings->TagToSplit,(char *)&local_18b);
          if (bVar1) {
            if (local_18b < 99) {
              if (local_18b == 0x43) {
                unaff_BPL = SplitListTagImpl<unsigned_char>(this,&local_188);
              }
              else if (local_18b == 0x49) {
                unaff_BPL = SplitListTagImpl<unsigned_int>(this,&local_188);
              }
              else {
                if (local_18b != 0x53) goto LAB_00136dc7;
                unaff_BPL = SplitListTagImpl<unsigned_short>(this,&local_188);
              }
            }
            else if (local_18b < 0x69) {
              if (local_18b == 99) {
                unaff_BPL = SplitListTagImpl<signed_char>(this,&local_188);
              }
              else if (local_18b == 0x66) {
                unaff_BPL = SplitListTagImpl<float>(this,&local_188);
              }
              else {
LAB_00136dc7:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "bamtools split ERROR: array tag has unsupported element type: ",0x3e);
                local_189 = local_18b;
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(char *)&local_189,1);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
                std::ostream::put((char)poVar3);
                std::ostream::flush();
                unaff_BPL = 0;
              }
            }
            else if (local_18b == 0x69) {
              unaff_BPL = SplitListTagImpl<int>(this,&local_188);
            }
            else {
              if (local_18b != 0x73) goto LAB_00136dc7;
              unaff_BPL = SplitListTagImpl<short>(this,&local_188);
            }
          }
          bVar1 = !bVar1;
          goto LAB_00136d04;
        case 0x43:
          unaff_BPL = SplitTagImpl<unsigned_char>(this,&local_188);
          break;
        default:
switchD_00136c21_caseD_44:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"bamtools split ERROR: unknown tag type encountered: ",
                     0x34);
          local_189 = local_18a;
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)&local_189,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          unaff_BPL = false;
          break;
        case 0x49:
          unaff_BPL = SplitTagImpl<unsigned_int>(this,&local_188);
        }
      }
      else if (local_18a < 0x66) {
        if (local_18a == 0x53) {
          unaff_BPL = SplitTagImpl<unsigned_short>(this,&local_188);
        }
        else {
          if (local_18a == 0x5a) goto switchD_00136c21_caseD_41;
          if (local_18a != 99) goto switchD_00136c21_caseD_44;
          unaff_BPL = SplitTagImpl<signed_char>(this,&local_188);
        }
      }
      else if (local_18a == 0x66) {
        unaff_BPL = SplitTagImpl<float>(this,&local_188);
      }
      else if (local_18a == 0x69) {
        unaff_BPL = SplitTagImpl<int>(this,&local_188);
      }
      else {
        if (local_18a != 0x73) goto switchD_00136c21_caseD_44;
        unaff_BPL = SplitTagImpl<short>(this,&local_188);
      }
      bVar1 = false;
    }
LAB_00136d04:
  } while (bVar1);
  BamAlignment::~BamAlignment(&local_188);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool SplitTool::SplitToolPrivate::SplitTag()
{

    // iterate through alignments, until we hit TAG
    BamAlignment al;
    while (m_reader.GetNextAlignment(al)) {

        // look for tag in this alignment and get tag type
        char tagType(0);
        if (!al.GetTagType(m_settings->TagToSplit, tagType)) {
            continue;
        }

        // request split method based on tag type
        // pass it the current alignment found
        switch (tagType) {

            case (Constants::BAM_TAG_TYPE_INT8):
                return SplitTagImpl<int8_t>(al);
            case (Constants::BAM_TAG_TYPE_INT16):
                return SplitTagImpl<int16_t>(al);
            case (Constants::BAM_TAG_TYPE_INT32):
                return SplitTagImpl<int32_t>(al);
            case (Constants::BAM_TAG_TYPE_UINT8):
                return SplitTagImpl<uint8_t>(al);
            case (Constants::BAM_TAG_TYPE_UINT16):
                return SplitTagImpl<uint16_t>(al);
            case (Constants::BAM_TAG_TYPE_UINT32):
                return SplitTagImpl<uint32_t>(al);
            case (Constants::BAM_TAG_TYPE_FLOAT):
                return SplitTagImpl<float>(al);

            case (Constants::BAM_TAG_TYPE_ASCII):
            case (Constants::BAM_TAG_TYPE_STRING):
            case (Constants::BAM_TAG_TYPE_HEX):
                return SplitTagImpl<std::string>(al);

            case (Constants::BAM_TAG_TYPE_ARRAY): {

                char arrayTagType(0);
                if (!al.GetArrayTagType(m_settings->TagToSplit, arrayTagType)) {
                    continue;
                }
                switch (arrayTagType) {
                    case (Constants::BAM_TAG_TYPE_INT8):
                        return SplitListTagImpl<int8_t>(al);
                    case (Constants::BAM_TAG_TYPE_INT16):
                        return SplitListTagImpl<int16_t>(al);
                    case (Constants::BAM_TAG_TYPE_INT32):
                        return SplitListTagImpl<int32_t>(al);
                    case (Constants::BAM_TAG_TYPE_UINT8):
                        return SplitListTagImpl<uint8_t>(al);
                    case (Constants::BAM_TAG_TYPE_UINT16):
                        return SplitListTagImpl<uint16_t>(al);
                    case (Constants::BAM_TAG_TYPE_UINT32):
                        return SplitListTagImpl<uint32_t>(al);
                    case (Constants::BAM_TAG_TYPE_FLOAT):
                        return SplitListTagImpl<float>(al);
                    default:
                        std::cerr
                            << "bamtools split ERROR: array tag has unsupported element type: "
                            << arrayTagType << std::endl;
                        return false;
                }
            }

            default:
                std::cerr << "bamtools split ERROR: unknown tag type encountered: " << tagType
                          << std::endl;
                return false;
        }
    }

    // tag not found, but that's not an error - return success
    return true;
}